

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

bool cppwinrt::implements_interface(TypeDef *type,string_view *name)

{
  uint32_t *values;
  bool bVar1;
  TypeDefOrRef TVar2;
  InterfaceImpl *pIVar3;
  coded_index<winmd::reader::TypeDefOrRef> cVar4;
  TypeDef TVar5;
  bool local_d1;
  undefined1 local_c0 [8];
  TypeDef base;
  undefined1 local_80 [8];
  coded_index<winmd::reader::TypeDefOrRef> iface;
  value_type *impl;
  InterfaceImpl __end1;
  InterfaceImpl __begin1;
  pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *__range1;
  string_view *name_local;
  TypeDef *type_local;
  
  winmd::reader::TypeDef::InterfaceImpl
            ((pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *)
             &__begin1.super_row_base<winmd::reader::InterfaceImpl>.m_index,type);
  values = &__begin1.super_row_base<winmd::reader::InterfaceImpl>.m_index;
  pIVar3 = winmd::reader::begin<winmd::reader::InterfaceImpl>
                     ((pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *)values);
  __end1.super_row_base<winmd::reader::InterfaceImpl>._8_8_ =
       (pIVar3->super_row_base<winmd::reader::InterfaceImpl>).m_table;
  __begin1.super_row_base<winmd::reader::InterfaceImpl>.m_table =
       *(table_base **)&(pIVar3->super_row_base<winmd::reader::InterfaceImpl>).m_index;
  pIVar3 = winmd::reader::end<winmd::reader::InterfaceImpl>
                     ((pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *)values);
  impl = (value_type *)(pIVar3->super_row_base<winmd::reader::InterfaceImpl>).m_table;
  __end1.super_row_base<winmd::reader::InterfaceImpl>.m_table =
       *(table_base **)&(pIVar3->super_row_base<winmd::reader::InterfaceImpl>).m_index;
  while( true ) {
    bVar1 = winmd::reader::row_base<winmd::reader::InterfaceImpl>::operator!=
                      ((row_base<winmd::reader::InterfaceImpl> *)
                       &__end1.super_row_base<winmd::reader::InterfaceImpl>.m_index,
                       (row_base<winmd::reader::InterfaceImpl> *)&impl);
    if (!bVar1) {
      TVar5 = get_base_class(type);
      local_c0 = (undefined1  [8])TVar5.super_row_base<winmd::reader::TypeDef>.m_table;
      base.super_row_base<winmd::reader::TypeDef>.m_table._0_4_ =
           TVar5.super_row_base<winmd::reader::TypeDef>.m_index;
      bVar1 = winmd::reader::row_base::operator_cast_to_bool((row_base *)local_c0);
      if (bVar1) {
        type_local._7_1_ = implements_interface((TypeDef *)local_c0,name);
      }
      else {
        type_local._7_1_ = false;
      }
      return type_local._7_1_;
    }
    iface.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>._8_8_ =
         winmd::reader::row_base<winmd::reader::InterfaceImpl>::operator*
                   ((row_base<winmd::reader::InterfaceImpl> *)
                    &__end1.super_row_base<winmd::reader::InterfaceImpl>.m_index);
    cVar4 = winmd::reader::InterfaceImpl::Interface
                      ((InterfaceImpl *)
                       iface.super_typed_index<winmd::reader::TypeDefOrRef>.
                       super_index_base<winmd::reader::TypeDefOrRef>._8_8_);
    local_80 = cVar4.super_typed_index<winmd::reader::TypeDefOrRef>.
               super_index_base<winmd::reader::TypeDefOrRef>.m_table;
    iface.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_table._0_4_ =
         cVar4.super_typed_index<winmd::reader::TypeDefOrRef>.
         super_index_base<winmd::reader::TypeDefOrRef>.m_value;
    TVar2 = winmd::reader::index_base<winmd::reader::TypeDefOrRef>::type
                      ((index_base<winmd::reader::TypeDefOrRef> *)local_80);
    local_d1 = false;
    if (TVar2 != TypeSpec) {
      type_name::type_name
                ((type_name *)&base.super_row_base<winmd::reader::TypeDef>.m_index,
                 (coded_index<winmd::reader::TypeDefOrRef> *)local_80);
      local_d1 = operator==((type_name *)&base.super_row_base<winmd::reader::TypeDef>.m_index,name);
    }
    if (local_d1 != false) break;
    winmd::reader::row_base<winmd::reader::InterfaceImpl>::operator++
              ((row_base<winmd::reader::InterfaceImpl> *)
               &__end1.super_row_base<winmd::reader::InterfaceImpl>.m_index);
  }
  return true;
}

Assistant:

static bool implements_interface(TypeDef const& type, std::string_view const& name)
    {
        for (auto&& impl : type.InterfaceImpl())
        {
            const auto iface = impl.Interface();
            if (iface.type() != TypeDefOrRef::TypeSpec && type_name(iface) == name)
            {
                return true;
            }
        }

        if (auto base = get_base_class(type))
        {
            return implements_interface(base, name);
        }
        else
        {
            return false;
        }
    }